

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoPrism> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoPrism> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018ad9d0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018ad628,DestMesh,&cp->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018ad328;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018b4f48;
  iVar1 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[1];
  iVar2 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[2];
  iVar3 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[3];
  iVar4 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[4];
  iVar5 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[5];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[2] = iVar2;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[3] = iVar3;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[4] = iVar4;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[5] = iVar5;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoPrism_018b4ec0;
  lVar6 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar6) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar6) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar6) = 0xffffffffffffffff;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x1f8);
  lVar6 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar6) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar6);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar6) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar6);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x1f8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}